

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystemDescriptor.cpp
# Opt level: O2

void __thiscall
chrono::ChSystemDescriptor::WriteMatrixSpmv(ChSystemDescriptor *this,string *path,string *prefix)

{
  int iVar1;
  Scalar *pSVar2;
  pointer ppCVar3;
  int i;
  long index;
  int size;
  ChVectorDynamic<> e;
  ChVectorDynamic<double> rhs;
  ChVectorDynamic<> v;
  Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> local_6f8;
  ChMatrixDynamic<> A;
  string filename;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_680;
  ChSparseMatrix Z;
  ChStreamOutAsciiFile file_rhs;
  ChStreamOutAsciiFile file_Z;
  
  filename._M_dataplus._M_p = (pointer)&filename.field_2;
  filename._M_string_length = 0;
  filename.field_2._M_local_buf[0] = '\0';
  iVar1 = 0;
  for (ppCVar3 = (this->vconstraints).
                 super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppCVar3 !=
      (this->vconstraints).
      super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppCVar3 = ppCVar3 + 1) {
    iVar1 = iVar1 + (uint)(*ppCVar3)->active;
  }
  size = iVar1 + this->n_q;
  Eigen::Matrix<double,-1,-1,1,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,1,_1,_1> *)&A,&size,&size);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&v,&size);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&e,&size);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&e);
  for (index = 0; index < size; index = index + 1) {
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&e,index);
    *pSVar2 = 1.0;
    (*this->_vptr_ChSystemDescriptor[0x17])
              (this,&v,(DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&e);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_-1,_1,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,_1,_false> *)&file_Z,&A,index);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,_1,1,false>,Eigen::Matrix<double,_1,1,0,_1,1>>
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,_1,_false> *)&file_Z,&v);
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&e,index);
    *pSVar2 = 0.0;
  }
  file_Z.super_ChStreamFile._16_16_ = vmovhps_avx(ZEXT816(0) << 0x40,0x3d719799812dea11);
  file_Z.super_ChStreamFile._vptr_ChStreamFile._0_1_ = 0;
  file_Z.super_ChStreamFile._8_8_ = &A;
  Eigen::SparseMatrix<double,1,int>::
  SparseMatrix<Eigen::SparseView<Eigen::Matrix<double,_1,_1,1,_1,_1>>>
            ((SparseMatrix<double,1,int> *)&Z,
             (SparseMatrixBase<Eigen::SparseView<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_> *)
             &file_Z);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_6f8,
                 path,"/");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file_rhs,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_6f8,
                 prefix);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file_Z,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file_rhs,
                 "_Z.dat");
  std::__cxx11::string::operator=((string *)&filename,(string *)&file_Z);
  std::__cxx11::string::~string((string *)&file_Z);
  std::__cxx11::string::~string((string *)&file_rhs);
  std::__cxx11::string::~string((string *)&local_6f8);
  ChStreamOutAsciiFile::ChStreamOutAsciiFile(&file_Z,filename._M_dataplus._M_p,_S_trunc);
  ChStreamOutAscii::SetNumFormat(&file_Z.super_ChStreamOutAscii,"%.12g");
  StreamOUTsparseMatlabFormat(&Z,&file_Z.super_ChStreamOutAscii);
  rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  (*this->_vptr_ChSystemDescriptor[0x1c])(this,0);
  std::operator+(&local_680,path,"/");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_6f8,
                 &local_680,prefix);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file_rhs,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_6f8,
                 "_rhs.dat");
  std::__cxx11::string::operator=((string *)&filename,(string *)&file_rhs);
  std::__cxx11::string::~string((string *)&file_rhs);
  std::__cxx11::string::~string((string *)&local_6f8);
  std::__cxx11::string::~string((string *)&local_680);
  ChStreamOutAsciiFile::ChStreamOutAsciiFile(&file_rhs,filename._M_dataplus._M_p,_S_trunc);
  ChStreamOutAscii::SetNumFormat(&file_rhs.super_ChStreamOutAscii,"%.12g");
  Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>const,0,Eigen::OuterStride<-1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::OuterStride<_1>> *)&local_6f8,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&rhs,(type *)0x0);
  StreamOUTdenseMatlabFormat(&local_6f8,&file_rhs.super_ChStreamOutAscii);
  Eigen::internal::handmade_aligned_free
            (local_6f8.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
             m_storage.m_data);
  ChStreamOutAsciiFile::~ChStreamOutAsciiFile(&file_rhs);
  Eigen::internal::handmade_aligned_free
            (rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  ChStreamOutAsciiFile::~ChStreamOutAsciiFile(&file_Z);
  Eigen::SparseMatrix<double,_1,_int>::~SparseMatrix(&Z);
  Eigen::internal::handmade_aligned_free
            (e.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  Eigen::internal::handmade_aligned_free
            (v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  Eigen::internal::handmade_aligned_free
            (A.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data);
  std::__cxx11::string::~string((string *)&filename);
  return;
}

Assistant:

void ChSystemDescriptor::WriteMatrixSpmv(const std::string& path, const std::string& prefix) {
    const char* numformat = "%.12g";
    std::string filename;

    // Count constraints.
    int mn_c = 0;
    for (auto& cnstr : vconstraints) {
        if (cnstr->IsActive())
            mn_c++;
    }

    // Generate dense system matrix, column by column
    int size = n_q + mn_c;
    ChMatrixDynamic<> A(size, size);
    ChVectorDynamic<> v(size);
    ChVectorDynamic<> e(size);
    e.setZero();

    for (int i = 0; i < size; i++) {
        e[i] = 1;
        SystemProduct(v, e);
        A.col(i) = v;
        e[i] = 0;
    }

    // Convert to Eigen sparse matrix
    ChSparseMatrix Z = A.sparseView();

    // Write sparse matrix to file
    filename = path + "/" + prefix + "_Z.dat";
    ChStreamOutAsciiFile file_Z(filename.c_str());
    file_Z.SetNumFormat(numformat);
    StreamOUTsparseMatlabFormat(Z, file_Z);

    // Write RHS to file
    ChVectorDynamic<double> rhs;
    ConvertToMatrixForm(nullptr, &rhs);
    filename = path + "/" + prefix + "_rhs.dat";
    ChStreamOutAsciiFile file_rhs(filename.c_str());
    file_rhs.SetNumFormat(numformat);
    StreamOUTdenseMatlabFormat(rhs, file_rhs);
}